

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlAddSpecialAttr(xmlParserCtxtPtr ctxt,xmlChar *fullname,xmlChar *fullattr,int type)

{
  xmlHashTablePtr pxVar1;
  void *pvVar2;
  
  if (ctxt->attsSpecial == (xmlHashTablePtr)0x0) {
    pxVar1 = xmlHashCreateDict(10,ctxt->dict);
    ctxt->attsSpecial = pxVar1;
    if (pxVar1 == (xmlHashTablePtr)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return;
    }
  }
  pvVar2 = xmlHashLookup2(ctxt->attsSpecial,fullname,fullattr);
  if (pvVar2 != (void *)0x0) {
    return;
  }
  xmlHashAddEntry2(ctxt->attsSpecial,fullname,fullattr,(void *)(ulong)(uint)type);
  return;
}

Assistant:

static void
xmlAddSpecialAttr(xmlParserCtxtPtr ctxt,
		  const xmlChar *fullname,
		  const xmlChar *fullattr,
		  int type)
{
    if (ctxt->attsSpecial == NULL) {
        ctxt->attsSpecial = xmlHashCreateDict(10, ctxt->dict);
	if (ctxt->attsSpecial == NULL)
	    goto mem_error;
    }

    if (xmlHashLookup2(ctxt->attsSpecial, fullname, fullattr) != NULL)
        return;

    xmlHashAddEntry2(ctxt->attsSpecial, fullname, fullattr,
                     (void *) (ptrdiff_t) type);
    return;

mem_error:
    xmlErrMemory(ctxt, NULL);
    return;
}